

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeProperty.cpp
# Opt level: O2

LengthPercentage
Rml::ComputeOrigin(Property *property,float font_size,float document_font_size,float dp_ratio,
                  Vector2f vp_dimensions)

{
  int iVar1;
  NumericValue value;
  ulong uVar2;
  float fVar3;
  
  if (property->unit == PERCENT) {
    fVar3 = Property::Get<float>(property);
  }
  else {
    if (property->unit != KEYWORD) {
      value = Property::GetNumericValue(property);
      fVar3 = ComputeLength(value,font_size,document_font_size,dp_ratio,vp_dimensions);
      uVar2 = 0;
      goto LAB_00254dbd;
    }
    iVar1 = Property::Get<int>(property);
    if ((char)iVar1 == '\x01') {
      fVar3 = 50.0;
    }
    else {
      fVar3 = 0.0;
    }
    if ((char)iVar1 == '\x02') {
      fVar3 = 100.0;
    }
  }
  uVar2 = 1;
LAB_00254dbd:
  return (LengthPercentage)((ulong)(uint)fVar3 << 0x20 | uVar2);
}

Assistant:

Style::LengthPercentage ComputeOrigin(const Property* property, float font_size, float document_font_size, float dp_ratio, Vector2f vp_dimensions)
{
	using namespace Style;
	static_assert(
		(int)OriginX::Left == (int)OriginY::Top && (int)OriginX::Center == (int)OriginY::Center && (int)OriginX::Right == (int)OriginY::Bottom, "");

	if (property->unit == Unit::KEYWORD)
	{
		float percent = 0.0f;
		OriginX origin = (OriginX)property->Get<int>();
		switch (origin)
		{
		case OriginX::Left: percent = 0.0f; break;
		case OriginX::Center: percent = 50.0f; break;
		case OriginX::Right: percent = 100.f; break;
		}
		return LengthPercentage(LengthPercentage::Percentage, percent);
	}
	else if (property->unit == Unit::PERCENT)
		return LengthPercentage(LengthPercentage::Percentage, property->Get<float>());

	return LengthPercentage(LengthPercentage::Length,
		ComputeLength(property->GetNumericValue(), font_size, document_font_size, dp_ratio, vp_dimensions));
}